

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall
r_code::list<unsigned_short>::push_back_new_cell(list<unsigned_short> *this,unsigned_short *t)

{
  size_type sVar1;
  undefined1 local_30 [8];
  cell c;
  unsigned_short *t_local;
  list<unsigned_short> *this_local;
  
  c._16_8_ = t;
  cell::cell((cell *)local_30);
  c.prev._0_2_ = *(undefined2 *)c._16_8_;
  local_30 = (undefined1  [8])0xffffffffffffffff;
  c.next = this->used_cells_tail;
  std::
  vector<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>::
  push_back(&this->cells,(value_type *)local_30);
  sVar1 = std::
          vector<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
          ::size(&this->cells);
  this->used_cells_tail = sVar1 - 1;
  return;
}

Assistant:

void push_back_new_cell(const T &t)
    {
        cell c;
        c.data = t;
        c.next = null;
        c.prev = used_cells_tail;
        cells.push_back(c);
        used_cells_tail = cells.size() - 1;
    }